

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5278::ktxStreamTest_CanWriteKtx1AsKtx2ToCppStream_Test::TestBody
          (ktxStreamTest_CanWriteKtx1AsKtx2ToCppStream_Test *this)

{
  ostream *poVar1;
  Message *pMVar2;
  char *pcVar3;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  ktx_error_code_e err;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_80;
  KtxTexture<ktxTexture1> srcTexture1;
  KtxTexture<ktxTexture2> dstTexture2;
  StreambufStream srcStream;
  _func_int **local_40;
  StreambufStream dstStream;
  
  err = KTX_INVALID_VALUE;
  std::make_unique<std::__cxx11::stringbuf>();
  srcStream._vptr_StreambufStream = local_40;
  StreambufStream::StreambufStream
            (&dstStream,
             (unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
              *)&srcStream,_S_out|_S_in);
  if (srcStream._vptr_StreambufStream != (_func_int **)0x0) {
    (**(code **)(*srcStream._vptr_StreambufStream + 8))();
  }
  srcTexture1._handle = (ktxTexture1 *)0x0;
  dstTexture2._handle = (ktxTexture2 *)0x0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Loading KTX1 from file");
  std::endl<char,std::char_traits<char>>(poVar1);
  StreambufStream::StreambufStream(&srcStream,&(this->super_ktxStreamTest)._ktx1Streambuf,_S_in);
  err = ktxTexture1_CreateFromStream
                  (srcStream._stream._M_t.
                   super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                   super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                   super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,&srcTexture1);
  gtest_ar_._0_8_ = (ulong)(uint)gtest_ar_._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)&gtest_ar,"err","KTX_SUCCESS",&err,(ktx_error_code_e *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),
                    "Failed to load source KTX1 from C++ stream: ");
    local_c0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ktxErrorString(err);
    pMVar2 = testing::Message::operator<<((Message *)&gtest_ar_,(char **)&local_c0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture1>,decltype(nullptr)>
            (&gtest_ar.success_,"srcTexture1",&srcTexture1,(void **)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    std::operator<<((ostream *)(gtest_ar_._0_8_ + 0x10),"Source KTX1 is null");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
               ,0x181,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    StreambufStream::~StreambufStream(&srcStream);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_.success_ = srcStream._destructed;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (srcStream._destructed == false) {
      testing::Message::Message((Message *)&local_c0);
      std::operator<<((ostream *)(local_c0._M_head_impl + 0x10),
                      "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"srcStream.destructed()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x182,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (local_c0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c0._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    StreambufStream::~StreambufStream(&srcStream);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Converting KTX1 -> KTX2");
    std::endl<char,std::char_traits<char>>(poVar1);
    dstStream._seek_mode = _S_out;
    err = ktxTexture1_WriteKTX2ToStream
                    (srcTexture1._handle,
                     dstStream._stream._M_t.
                     super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                     super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                     super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl);
    gtest_ar._0_8_ = (ulong)(uint)gtest_ar._4_4_ << 0x20;
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)&srcStream,"err","KTX_SUCCESS",&err,(ktx_error_code_e *)&gtest_ar);
    if ((char)srcStream._vptr_StreambufStream == '\0') {
      testing::Message::Message((Message *)&gtest_ar);
      std::operator<<((ostream *)(gtest_ar._0_8_ + 0x10),
                      "Failed to convert KTX1 -> KTX2 to C++ stream: ");
      gtest_ar_._0_8_ = ktxErrorString(err);
      pMVar2 = testing::Message::operator<<((Message *)&gtest_ar,(char **)&gtest_ar_);
      if ((__uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           )srcStream._streambuf._M_t.
            super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl ==
          (__uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)srcStream._streambuf._M_t.
                           super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x18b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if (gtest_ar._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&srcStream._streambuf);
    poVar1 = std::operator<<((ostream *)&std::cerr,"Loading the converted KTX2");
    std::endl<char,std::char_traits<char>>(poVar1);
    (**(code **)(*(long *)dstStream._streambuf._M_t.
                          super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>
                          ._M_head_impl + 0x28))
              (dstStream._streambuf._M_t.
               super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl,0,0,8);
    dstStream._seek_mode = _S_in;
    err = ktxTexture2_CreateFromStream
                    (dstStream._stream._M_t.
                     super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                     super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                     super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,&dstTexture2);
    gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)&srcStream,"err","KTX_SUCCESS",&err,(ktx_error_code_e *)&gtest_ar);
    if ((char)srcStream._vptr_StreambufStream == '\0') {
      testing::Message::Message((Message *)&gtest_ar);
      std::operator<<((ostream *)(gtest_ar._0_8_ + 0x10),
                      "Failed to load converted KTX2 from C++ stream: ");
      gtest_ar_._0_8_ = ktxErrorString(err);
      pMVar2 = testing::Message::operator<<((Message *)&gtest_ar,(char **)&gtest_ar_);
      if ((__uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           )srcStream._streambuf._M_t.
            super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl ==
          (__uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)srcStream._streambuf._M_t.
                           super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x195,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
      if (gtest_ar._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&srcStream._streambuf);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0;
    testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture2>,decltype(nullptr)>
              ((char *)&srcStream,"dstTexture2",&dstTexture2,(void **)&gtest_ar);
    if ((char)srcStream._vptr_StreambufStream == '\0') {
      testing::Message::Message((Message *)&gtest_ar);
      std::operator<<((ostream *)(gtest_ar._0_8_ + 0x10),"Destination KTX2 is null");
      if ((__uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           )srcStream._streambuf._M_t.
            super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
            .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
            _M_head_impl ==
          (__uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           )0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)srcStream._streambuf._M_t.
                           super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/streamtests/streamtests.cc"
                 ,0x196,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if (gtest_ar._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&srcStream._streambuf);
  }
  KtxTexture<ktxTexture2>::~KtxTexture(&dstTexture2);
  KtxTexture<ktxTexture1>::~KtxTexture(&srcTexture1);
  StreambufStream::~StreambufStream(&dstStream);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanWriteKtx1AsKtx2ToCppStream)
{
    KTX_error_code err{KTX_INVALID_VALUE};
    auto dstStreambuf = std::make_unique<std::stringbuf>();
    StreambufStream dstStream{std::move(dstStreambuf)};

    KtxTexture<ktxTexture1> srcTexture1{nullptr};
    KtxTexture<ktxTexture2> dstTexture2{nullptr};

    {
        std::cerr << "Loading KTX1 from file" << std::endl;

        StreambufStream srcStream{std::move(_ktx1Streambuf), std::ios::in};
        err = ktxTexture1_CreateFromStream(srcStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, srcTexture1.pHandle());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to load source KTX1 from C++ stream: " << ktxErrorString(err);
        ASSERT_NE(srcTexture1, nullptr) << "Source KTX1 is null";
        EXPECT_TRUE(srcStream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
    }
    {
        std::cerr << "Converting KTX1 -> KTX2" << std::endl;

        // We're about to write to `dstStream`
        dstStream.seek_mode(std::ios::out);

        err = ktxTexture1_WriteKTX2ToStream(srcTexture1, dstStream.stream());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to convert KTX1 -> KTX2 to C++ stream: " << ktxErrorString(err);
    }
    {
        std::cerr << "Loading the converted KTX2" << std::endl;

        // Rewind dstStream and set it up for reading
        dstStream.streambuf()->pubseekpos(0, std::ios::in);
        dstStream.seek_mode(std::ios::in);

        err = ktxTexture2_CreateFromStream(dstStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, dstTexture2.pHandle());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to load converted KTX2 from C++ stream: " << ktxErrorString(err);
        ASSERT_NE(dstTexture2, nullptr) << "Destination KTX2 is null";
    }
}